

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timMan.c
# Opt level: O2

float * Tim_ManGetArrTimes(Tim_Man_t *p)

{
  float fVar1;
  uint uVar2;
  Tim_Obj_t *pTVar3;
  int iVar4;
  ulong uVar5;
  float *__s;
  ulong uVar6;
  long lVar7;
  float *pfVar8;
  
  uVar5 = 0;
  uVar6 = (ulong)(uint)p->nCis;
  if (p->nCis < 1) {
    uVar6 = uVar5;
  }
  lVar7 = 0x10;
  do {
    if (uVar6 == uVar5) {
LAB_0038bf24:
      iVar4 = Tim_ManPiNum(p);
      lVar7 = 0;
      if ((int)uVar6 == iVar4) {
        __s = (float *)0x0;
      }
      else {
        uVar2 = p->nCis;
        __s = (float *)malloc((long)(int)uVar2 << 2);
        memset(__s,0xff,(long)(int)uVar2 << 2);
        uVar6 = 0;
        if (0 < (int)uVar2) {
          uVar6 = (ulong)uVar2;
        }
        pfVar8 = __s;
        while ((uVar6 * 6 - lVar7 != 0 && (pTVar3 = p->pCis, pTVar3 != (Tim_Obj_t *)0x0))) {
          if ((&pTVar3->iObj2Box)[lVar7] < 0) {
            *pfVar8 = (&pTVar3->timeArr)[lVar7];
          }
          lVar7 = lVar7 + 6;
          pfVar8 = pfVar8 + 1;
        }
      }
      return __s;
    }
    pTVar3 = p->pCis;
    if ((pTVar3 == (Tim_Obj_t *)0x0) ||
       ((*(int *)((long)pTVar3 + lVar7 + -8) < 0 &&
        ((fVar1 = *(float *)((long)&pTVar3->Id + lVar7), fVar1 != 0.0 || (NAN(fVar1))))))) {
      uVar6 = uVar5 & 0xffffffff;
      goto LAB_0038bf24;
    }
    uVar5 = uVar5 + 1;
    lVar7 = lVar7 + 0x18;
  } while( true );
}

Assistant:

float * Tim_ManGetArrTimes( Tim_Man_t * p )
{
    float * pTimes;
    Tim_Obj_t * pObj;
    int i;
    Tim_ManForEachPi( p, pObj, i )
        if ( pObj->timeArr != 0.0 )
            break;
    if ( i == Tim_ManPiNum(p) )
        return NULL;
    pTimes  = ABC_FALLOC( float, Tim_ManCiNum(p) );
    Tim_ManForEachPi( p, pObj, i )
        pTimes[i] = pObj->timeArr;
    return pTimes;
}